

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8DifferentPoliciesTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section8DifferentPoliciesTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  undefined1 local_f8 [8];
  PkitsTestInfo info;
  char *crls [5];
  char *pcStack_48;
  char *certs [6];
  Section8DifferentPoliciesTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  certs[3] = "PoliciesP123subsubsubCAP12P2P1Cert";
  certs[4] = "DifferentPoliciesTest9EE";
  certs[1] = "PoliciesP123subCAP12Cert";
  certs[2] = "PoliciesP123subsubCAP12P2Cert";
  pcStack_48 = "TrustAnchorRootCertificate";
  certs[0] = "PoliciesP123CACert";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_f8);
  local_f8 = (undefined1  [8])0x6f53f0;
  info.time.year._0_1_ = 0;
  PkitsTestInfo::SetUserConstrainedPolicySet((PkitsTestInfo *)local_f8,"");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<6ul,5ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)this
             ,(char *(*) [6])&pcStack_48,
             (char *(*) [5])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_f8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_f8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8DifferentPoliciesTest9) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate",         "PoliciesP123CACert",
      "PoliciesP123subCAP12Cert",           "PoliciesP123subsubCAP12P2Cert",
      "PoliciesP123subsubsubCAP12P2P1Cert", "DifferentPoliciesTest9EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "PoliciesP123CACRL", "PoliciesP123subCAP12CRL",
      "PoliciesP123subsubCAP2P2CRL", "PoliciesP123subsubsubCAP12P2P1CRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.9";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}